

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

void dump_ports_cb(Port *p,char *name,char *param_3,Ports *param_4,void *v,void *param_6)

{
  bool bVar1;
  bool bVar2;
  MetaContainer MVar3;
  size_type sVar4;
  int iVar5;
  int iVar6;
  iterator iVar7;
  char *__s;
  char *pcVar8;
  char *pcVar9;
  ostream *poVar10;
  size_t sVar11;
  bool bVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  MetaIterator MVar16;
  MetaContainer meta;
  string doc;
  MetaContainer local_120;
  pair<const_char_*,_const_char_*> local_118;
  char local_108;
  undefined7 uStack_107;
  char *local_f8;
  string local_f0;
  allocator<char> local_c9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  char *local_88;
  string local_80;
  Port *local_60;
  char *local_58;
  string local_50;
  
  local_88 = name;
  if (dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)::
      already_dumped_abi_cxx11_ == '\0') {
    dump_ports_cb();
  }
  local_118.second = p->name;
  local_118.first = local_88;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>(&local_c8,&local_118);
  iVar7 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
                  ::already_dumped_abi_cxx11_._M_t,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.second._M_dataplus._M_p != &local_c8.second.field_2) {
    operator_delete(local_c8.second._M_dataplus._M_p,
                    local_c8.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
    operator_delete(local_c8.first._M_dataplus._M_p,
                    CONCAT71(local_c8.first.field_2._M_allocated_capacity._1_7_,
                             local_c8.first.field_2._M_local_buf[0]) + 1);
  }
  if ((_Rb_tree_header *)iVar7._M_node !=
      &dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)::
       already_dumped_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  local_f8 = local_88;
  pcVar13 = p->metadata;
  if ((pcVar13 != (char *)0x0) && (*pcVar13 == ':')) {
    pcVar13 = pcVar13 + 1;
  }
  rtosc::Port::MetaContainer::MetaContainer((MetaContainer *)&local_c8,pcVar13);
  local_120.str_ptr = local_c8.first._M_dataplus._M_p;
  __s = strchr(p->name,0x3a);
  MVar16 = rtosc::Port::MetaContainer::find(&local_120,"parameter");
  pcVar9 = MVar16.title;
  MVar16 = rtosc::Port::MetaContainer::find(&local_120,"documentation");
  pcVar8 = MVar16.title;
  local_c8.first._M_dataplus._M_p = (pointer)&local_c8.first.field_2;
  local_c8.first._M_string_length = 0;
  local_c8.first.field_2._M_local_buf[0] = '\0';
  pcVar13 = p->metadata;
  if ((pcVar13 == (char *)0x0) || (*pcVar13 != ':')) {
    rtosc::Port::MetaContainer::MetaContainer((MetaContainer *)&local_118,pcVar13);
  }
  else {
    rtosc::Port::MetaContainer::MetaContainer((MetaContainer *)&local_118,pcVar13 + 1);
  }
  rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_118,(char *)0x0);
  sVar4 = local_c8.first._M_string_length;
  local_60 = p;
  if (pcVar8 != local_118.first) {
    local_58 = pcVar9;
    strlen(MVar16.value);
    pcVar9 = local_58;
    p = local_60;
    std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)sVar4,(ulong)MVar16.value);
  }
  MVar16 = rtosc::Port::MetaContainer::find(&local_120,"internal");
  rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_118,(char *)0x0);
  if (MVar16.title != local_118.first) {
    std::__cxx11::string::append((char *)&local_c8);
  }
  pcVar13 = p->metadata;
  if ((pcVar13 == (char *)0x0) || (*pcVar13 != ':')) {
    rtosc::Port::MetaContainer::MetaContainer((MetaContainer *)&local_118,pcVar13);
  }
  else {
    rtosc::Port::MetaContainer::MetaContainer((MetaContainer *)&local_118,pcVar13 + 1);
  }
  rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_118,(char *)0x0);
  if (pcVar9 == local_118.first) {
    rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_118,(char *)0x0);
    if (pcVar8 == local_118.first) {
      bVar12 = false;
      bVar15 = false;
    }
    else if (__s == (char *)0x0) {
      bVar15 = true;
      bVar12 = false;
    }
    else {
      local_118.first = &local_108;
      local_118.second = (char *)0x0;
      local_108 = '\0';
      iVar6 = std::__cxx11::string::compare((char *)&local_118);
      bVar15 = iVar6 == 0;
      bVar12 = true;
    }
    if ((bVar12) && (local_118.first != &local_108)) {
      operator_delete(local_118.first,CONCAT71(uStack_107,local_108) + 1);
    }
    if (bVar15) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,local_f8,(allocator<char> *)&local_50);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_c8.first._M_dataplus._M_p,
                 (char *)(local_c8.first._M_string_length + (long)local_c8.first._M_dataplus._M_p));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_in pattern=\"",0x16);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" typetag=\"*\">\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>",8);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_in>\n",0xf);
    }
    else {
      rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f0,(char *)0x0);
      if ((__s == (char *)0x0) || (pcVar8 == local_f0._M_dataplus._M_p)) {
        rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f0,(char *)0x0);
        if (pcVar8 == local_f0._M_dataplus._M_p) {
          pcVar13 = "Skipping [UNDOCUMENTED] \"%s\"\n";
          __s = local_f8;
        }
        else {
          bVar12 = false;
          fprintf(_stderr,"Skipping \"%s\"\n",local_f8);
          if (__s == (char *)0x0) goto LAB_00108525;
          pcVar13 = "    type = %s\n";
        }
        bVar12 = false;
        fprintf(_stderr,pcVar13,__s);
        goto LAB_00108525;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,local_f8,&local_c9);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_c8.first._M_dataplus._M_p,
                 (char *)(local_c8.first._M_string_length + (long)local_c8.first._M_dataplus._M_p));
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar11 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar11);
      dump_generic_port((ostream *)v,&local_f0,&local_80,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar13 = "";
    if (__s == (char *)0x0) {
      bVar15 = true;
      bVar1 = false;
      bVar2 = false;
      bVar12 = false;
    }
    else {
      pcVar9 = strchr(__s,0x66);
      if (pcVar9 == (char *)0x0) {
        pcVar9 = strchr(__s,0x69);
        if (pcVar9 != (char *)0x0) {
          bVar12 = true;
          goto LAB_001075d3;
        }
        pcVar9 = strchr(__s,99);
        if (pcVar9 != (char *)0x0) {
          bVar12 = true;
          bVar2 = true;
          bVar15 = false;
          bVar1 = false;
          goto LAB_001075da;
        }
        pcVar9 = strchr(__s,0x54);
        bVar15 = false;
        if (pcVar9 == (char *)0x0) {
          pcVar9 = strchr(__s,0x73);
          bVar15 = pcVar9 == (char *)0x0;
          bVar12 = !bVar15;
          bVar1 = false;
        }
        else {
          bVar12 = false;
          bVar1 = true;
        }
      }
      else {
        bVar12 = false;
        pcVar13 = "lmin=\"[\" lmax=\"]\"";
LAB_001075d3:
        bVar15 = false;
        bVar1 = false;
      }
      bVar2 = false;
    }
LAB_001075da:
    if (bVar15) {
      dump_ports_cb();
      bVar15 = false;
      bVar12 = false;
    }
    else if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,local_f8,(allocator<char> *)&local_80);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_c8.first._M_dataplus._M_p,
                 (char *)(local_c8.first._M_string_length + (long)local_c8.first._M_dataplus._M_p));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_in pattern=\"",0x16);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_118.first,(long)local_118.second);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" typetag=\"T\">\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Enable ",0xf);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v,"  <param_T symbol=\"x\"/>\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_in>\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_in pattern=\"",0x16);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_118.first,(long)local_118.second);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" typetag=\"F\">\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Disable ",0x10);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v,"  <param_F symbol=\"x\"/>\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_in>\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_in pattern=\"",0x16);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_118.first,(long)local_118.second);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" typetag=\"\">\n",0xe);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Get state of ",0x15);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_in>\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_out pattern=\"",0x17);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_118.first,(long)local_118.second);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" typetag=\"T\">\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Value of ",0x11);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v,"  <param_T symbol=\"x\"/>",0x17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_out>\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_out pattern=\"",0x17);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_118.first,(long)local_118.second);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" typetag=\"F\">\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Value of ",0x11);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v,"  <param_F symbol=\"x\"/>",0x17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_out>\n",0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (local_118.first != &local_108) {
        operator_delete(local_118.first,CONCAT71(uStack_107,local_108) + 1);
      }
      bVar12 = true;
      bVar15 = false;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_in pattern=\"",0x16);
      pcVar9 = local_f8;
      iVar6 = (int)v;
      if (local_f8 == (char *)0x0) {
        std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
      }
      else {
        sVar11 = strlen(local_f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar9,sVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\" typetag=\"",0xb);
      local_118.first = (char *)CONCAT71(local_118.first._1_7_,bVar12);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,(char *)&local_118,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\">\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Set Value of ",0x15);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_c8.first._M_dataplus._M_p,
                           local_c8.first._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      MVar16 = rtosc::Port::MetaContainer::find(&local_120,"min");
      rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_118,(char *)0x0);
      if (MVar16.title == local_118.first) {
LAB_00107a7a:
        MVar16 = rtosc::Port::MetaContainer::find(&local_120,"enumerated");
        rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_118,(char *)0x0);
        if (MVar16.title == local_118.first) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <param_",9);
          local_118.first = (char *)CONCAT71(local_118.first._1_7_,bVar12);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)v,(char *)&local_118,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," symbol=\"x\"",0xb);
          pcVar9 = rtosc::Port::MetaContainer::operator[](&local_120,"unit");
          units((ostream *)v,pcVar9);
          lVar14 = 3;
          pcVar9 = "/>\n";
          poVar10 = (ostream *)v;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <param_",9);
          local_118.first._0_1_ = bVar12;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)v,(char *)&local_118,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," symbol=\"x\">\n",0xd);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)v,"    <range_min_max min=\"",0x18);
          MVar3.str_ptr = local_120.str_ptr;
          iVar5 = enum_min(local_120);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)v,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" max=\"",7);
          iVar5 = enum_max(MVar3);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)v,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\">\n",3);
          add_options((ostream *)v,MVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)v,"    </range_min_max>\n",0x15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  </param_",10);
          local_118.first = (char *)CONCAT71(local_118.first._1_7_,bVar12);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)v,(char *)&local_118,1);
          lVar14 = 2;
          pcVar9 = ">\n";
        }
      }
      else {
        MVar16 = rtosc::Port::MetaContainer::find(&local_120,"max");
        rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_118,(char *)0x0);
        if (MVar16.title == local_118.first || bVar2) goto LAB_00107a7a;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <param_",9);
        local_118.first = (char *)CONCAT71(local_118.first._1_7_,bVar12);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)v,(char *)&local_118,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," symbol=\"x\"",0xb);
        pcVar9 = rtosc::Port::MetaContainer::operator[](&local_120,"unit");
        units((ostream *)v,pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,">\n",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"   <range_min_max ",0x12);
        sVar11 = strlen(pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar13,sVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," min=\"",6);
        pcVar9 = rtosc::Port::MetaContainer::operator[](&local_120,"min");
        if (pcVar9 == (char *)0x0) {
          std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
        }
        else {
          sVar11 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar9,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\"  max=\"",8);
        pcVar9 = rtosc::Port::MetaContainer::operator[](&local_120,"max");
        if (pcVar9 == (char *)0x0) {
          std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
        }
        else {
          sVar11 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar9,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\"/>\n",4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  </param_",10);
        local_118.first = (char *)CONCAT71(local_118.first._1_7_,bVar12);
        lVar14 = 1;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)v,(char *)&local_118,1);
        pcVar9 = ">";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,lVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_in>\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_in pattern=\"",0x16);
      pcVar9 = local_f8;
      if (local_f8 == (char *)0x0) {
        std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
      }
      else {
        sVar11 = strlen(local_f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar9,sVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\" typetag=\"\">\n",0xe);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Get Value of ",0x15);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_c8.first._M_dataplus._M_p,
                           local_c8.first._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_in>\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_out pattern=\"",0x17);
      pcVar9 = local_f8;
      if (local_f8 == (char *)0x0) {
        std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
      }
      else {
        sVar11 = strlen(local_f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar9,sVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\" typetag=\"",0xb);
      local_118.first = (char *)CONCAT71(local_118.first._1_7_,bVar12);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,(char *)&local_118,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\">\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Value of ",0x11);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_c8.first._M_dataplus._M_p,
                           local_c8.first._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      MVar16 = rtosc::Port::MetaContainer::find(&local_120,"min");
      rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_118,(char *)0x0);
      if (MVar16.title == local_118.first) {
LAB_001081d0:
        MVar16 = rtosc::Port::MetaContainer::find(&local_120,"enumerated");
        rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_118,(char *)0x0);
        if (MVar16.title == local_118.first) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <param_",9);
          local_118.first = (char *)CONCAT71(local_118.first._1_7_,bVar12);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)v,(char *)&local_118,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," symbol=\"x\"",0xb);
          pcVar13 = rtosc::Port::MetaContainer::operator[](&local_120,"unit");
          units((ostream *)v,pcVar13);
          lVar14 = 3;
          pcVar9 = "/>\n";
          poVar10 = (ostream *)v;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <param_",9);
          local_118.first._0_1_ = bVar12;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)v,(char *)&local_118,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," symbol=\"x\">\n",0xd);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)v,"    <range_min_max min=\"",0x18);
          MVar3.str_ptr = local_120.str_ptr;
          iVar6 = enum_min(local_120);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)v,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" max=\"",7);
          iVar6 = enum_max(MVar3);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)v,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\">\n",3);
          add_options((ostream *)v,MVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)v,"    </range_min_max>\n",0x15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  </param_",10);
          local_118.first = (char *)CONCAT71(local_118.first._1_7_,bVar12);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)v,(char *)&local_118,1);
          lVar14 = 2;
          pcVar9 = ">\n";
        }
      }
      else {
        MVar16 = rtosc::Port::MetaContainer::find(&local_120,"max");
        rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_118,(char *)0x0);
        if (bVar2 || MVar16.title == local_118.first) goto LAB_001081d0;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <param_",9);
        local_118.first = (char *)CONCAT71(local_118.first._1_7_,bVar12);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)v,(char *)&local_118,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," symbol=\"x\"",0xb);
        pcVar9 = rtosc::Port::MetaContainer::operator[](&local_120,"unit");
        units((ostream *)v,pcVar9);
        pcVar9 = ">\n";
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,">\n",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"   <range_min_max ",0x12);
        sVar11 = strlen(pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar13,sVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," min=\"",6);
        pcVar13 = rtosc::Port::MetaContainer::operator[](&local_120,"min");
        if (pcVar13 == (char *)0x0) {
          std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
        }
        else {
          sVar11 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar13,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\"  max=\"",8);
        pcVar13 = rtosc::Port::MetaContainer::operator[](&local_120,"max");
        if (pcVar13 == (char *)0x0) {
          std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
        }
        else {
          sVar11 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar13,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\"/>\n",4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  </param_",10);
        local_118.first = (char *)CONCAT71(local_118.first._1_7_,bVar12);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)v,(char *)&local_118,1);
        lVar14 = 2;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,lVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_out>\n",0x10);
      bVar15 = true;
    }
    if (!bVar15) goto LAB_00108525;
  }
  bVar12 = true;
LAB_00108525:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
    operator_delete(local_c8.first._M_dataplus._M_p,
                    CONCAT71(local_c8.first.field_2._M_allocated_capacity._1_7_,
                             local_c8.first.field_2._M_local_buf[0]) + 1);
  }
  if (bVar12) {
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_emplace_unique<char_const*&,char_const*const&>
              ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
                   ::already_dumped_abi_cxx11_,&local_88,&local_60->name);
  }
  return;
}

Assistant:

static void dump_ports_cb(const rtosc::Port *p, const char *name,const char*,
                          const Ports&,void *v, void*)
{
    static std::set<std::pair<std::string, std::string>> already_dumped;
    if(already_dumped.find(std::make_pair(name, p->name)) == already_dumped.end())
    {
        bool dumped = do_dump_ports(p, name, v);
        if(dumped)
            already_dumped.emplace(name, p->name);
    }
}